

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O2

void jpeg_stdio_dest(j_compress_ptr cinfo,FILE *outfile)

{
  jpeg_error_mgr *pjVar1;
  jpeg_destination_mgr *pjVar2;
  
  pjVar2 = cinfo->dest;
  if (pjVar2 == (jpeg_destination_mgr *)0x0) {
    pjVar2 = (jpeg_destination_mgr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x38);
    cinfo->dest = pjVar2;
  }
  else if (pjVar2->init_destination != init_destination) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x17;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
    pjVar2 = cinfo->dest;
  }
  pjVar2->init_destination = init_destination;
  pjVar2->empty_output_buffer = empty_output_buffer;
  pjVar2->term_destination = term_destination;
  pjVar2[1].next_output_byte = (JOCTET *)outfile;
  return;
}

Assistant:

GLOBAL(void)
jpeg_stdio_dest(j_compress_ptr cinfo, FILE *outfile)
{
  my_dest_ptr dest;

  /* The destination object is made permanent so that multiple JPEG images
   * can be written to the same file without re-executing jpeg_stdio_dest.
   */
  if (cinfo->dest == NULL) {    /* first time for this JPEG object? */
    cinfo->dest = (struct jpeg_destination_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                  sizeof(my_destination_mgr));
  } else if (cinfo->dest->init_destination != init_destination) {
    /* It is unsafe to reuse the existing destination manager unless it was
     * created by this function.  Otherwise, there is no guarantee that the
     * opaque structure is the right size.  Note that we could just create a
     * new structure, but the old structure would not be freed until
     * jpeg_destroy_compress() was called.
     */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  }

  dest = (my_dest_ptr)cinfo->dest;
  dest->pub.init_destination = init_destination;
  dest->pub.empty_output_buffer = empty_output_buffer;
  dest->pub.term_destination = term_destination;
  dest->outfile = outfile;
}